

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

void Curl_hash_destroy(Curl_hash *h)

{
  long lVar1;
  ulong uVar2;
  
  if (h->table != (Curl_llist *)0x0) {
    if (h->slots != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        Curl_llist_destroy((Curl_llist *)((long)&h->table->_head + lVar1),h);
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x20;
      } while (uVar2 < h->slots);
    }
    (*Curl_cfree)(h->table);
    h->table = (Curl_llist *)0x0;
  }
  h->slots = 0;
  h->size = 0;
  return;
}

Assistant:

void
Curl_hash_destroy(struct Curl_hash *h)
{
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    size_t i;
    for(i = 0; i < h->slots; ++i) {
      Curl_llist_destroy(&h->table[i], (void *) h);
    }
    Curl_safefree(h->table);
  }
  h->size = 0;
  h->slots = 0;
}